

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace.h
# Opt level: O1

void __thiscall CP::list<int>::replace(list<int> *this,int *x,list<int> *y)

{
  int iVar1;
  node *pnVar2;
  node *pnVar3;
  iterator it;
  node *pnVar4;
  size_t sVar5;
  node *pnVar6;
  
  it.ptr = this->mHeader->next;
  if (this->mHeader != it.ptr) {
    do {
      if ((it.ptr)->data == *x) {
        it = erase(this,it);
        pnVar2 = y->mHeader;
        pnVar6 = pnVar2->next;
        if (pnVar2 != pnVar6) {
          sVar5 = this->mSize;
          do {
            sVar5 = sVar5 + 1;
            iVar1 = pnVar6->data;
            pnVar4 = (node *)operator_new(0x18);
            pnVar3 = (it.ptr)->prev;
            pnVar4->data = iVar1;
            pnVar4->prev = pnVar3;
            pnVar4->next = it.ptr;
            pnVar3->next = pnVar4;
            (it.ptr)->prev = pnVar4;
            this->mSize = sVar5;
            pnVar6 = pnVar6->next;
          } while (pnVar2 != pnVar6);
        }
      }
      else {
        it.ptr = (it.ptr)->next;
      }
    } while (this->mHeader != it.ptr);
  }
  return;
}

Assistant:

void replace(const T &x, list<T> &y) {
    auto it = begin();
    while (it != end()) {
        if (*it == x) {
            it = erase(it);
            for (auto val : y) {
                insert(it, val);
            }
        } else {
            ++it;
        }
    }
}